

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_138::GlobalRefining::run(GlobalRefining *this,Module *module)

{
  __node_base_ptr *__dest;
  Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_> *this_00;
  pointer puVar1;
  Function *pFVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long *plVar5;
  PassRunner *pPVar6;
  undefined8 *puVar7;
  _func_int **pp_Var8;
  _Any_data *p_Var9;
  bool bVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  Type TVar13;
  _Rb_tree_node_base *p_Var14;
  size_type sVar15;
  Type left;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  undefined8 *puVar16;
  long *plVar17;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar18;
  _Base_ptr p_Var19;
  undefined1 auVar20 [8];
  undefined1 local_348 [8];
  unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
  lubs;
  Index IStack_308;
  undefined1 local_258 [8];
  GetUpdater updater;
  code *local_108;
  ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  unoptimizable;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data *local_40;
  _Rb_tree_node_base *local_38;
  
  if (((module->features).features & 0x400) != 0) {
    unoptimizable._M_h._M_single_bucket = (__node_base_ptr)0x0;
    analysis._24_8_ = &analysis.field_0x8;
    analysis._8_4_ = 0;
    analysis._16_8_ = 0;
    analysis._40_8_ = 0;
    puVar18 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    analysis._32_8_ = analysis._24_8_;
    local_40 = (_Any_data *)module;
    if (puVar18 != puVar1) {
      do {
        local_258 = (undefined1  [8])
                    (puVar18->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        std::
        map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
        ::operator[]((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                      *)&analysis,(key_type *)local_258);
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar1);
    }
    std::function<void_(wasm::Function_*,_GlobalInfo_&)>::function
              ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)&local_60,
               (function<void_(wasm::Function_*,_GlobalInfo_&)> *)
               &unoptimizable._M_h._M_single_bucket);
    puVar18 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != puVar1) {
      do {
        pFVar2 = (puVar18->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
          local_348 = (undefined1  [8])pFVar2;
          pmVar11 = std::
                    map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                    ::operator[]((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                                  *)&analysis,(key_type *)local_348);
          local_258 = (undefined1  [8])pFVar2;
          if (local_50 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_48)(&local_60,(Function **)local_258,pmVar11);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar1);
    }
    local_348 = (undefined1  [8])&PTR__PassRunner_01091270;
    lubs._M_h._M_bucket_count = (size_type)&module->allocator;
    lubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    lubs._M_h._M_element_count._0_4_ = 0;
    lubs._M_h._M_element_count._4_4_ = 0;
    lubs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
    lubs._M_h._M_rehash_policy._1_7_ = 0;
    lubs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
    lubs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0x101;
    lubs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
    lubs._M_h._M_single_bucket._0_4_ = 0;
    lubs._M_h._M_single_bucket._4_4_ = 2;
    IStack_308 = 0xffffffff;
    lubs._M_h._M_buckets = (__buckets_ptr)module;
    std::function<void_(wasm::Function_*,_GlobalInfo_&)>::function
              ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)&analysis.field_0x30,
               (function<void_(wasm::Function_*,_GlobalInfo_&)> *)&local_60);
    wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::
    run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::
    doAnalysis(std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::
    run(wasm::Module*)::GlobalInfo&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::
    (anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,std::less<wasm::
    Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
    GlobalRefining::run(wasm::Module*)::GlobalInfo>>>&,std::function<void(wasm::Function*,wasm::
    (anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo__>_
              (local_258,module,(Map *)&analysis,(Func *)&analysis.field_0x30);
    if (updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass._vptr_Pass != (_func_int **)local_348 &&
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass._vptr_Pass != (_func_int **)0x0) {
LAB_00881557:
      __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                    ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
    }
    updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
    super_Pass._vptr_Pass = (_func_int **)local_348;
    (**(code **)&(((Importable *)local_258)->super_Named).hasExplicitName)(local_258,module);
    local_258 = (undefined1  [8])&PTR__Mapper_010925f8;
    if (local_108 != (code *)0x0) {
      (*local_108)(&updater.wasm,&updater.wasm,3);
    }
    if (updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed._M_elems[9].currp !=
        (Expression **)0x0) {
      operator_delete(updater.
                      super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                      .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
                      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed.
                      _M_elems[9].currp,
                      (long)updater.
                            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                            .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
                            super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)updater.
                            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                            .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
                            super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed.
                            _M_elems[9].currp);
    }
    Pass::~Pass((Pass *)local_258);
    if (unoptimizable._M_h._M_bucket_count != 0) {
      (*(code *)unoptimizable._M_h._M_bucket_count)(&analysis.field_0x30,&analysis.field_0x30,3);
    }
    PassRunner::~PassRunner((PassRunner *)local_348);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    __dest = &unoptimizable._M_h._M_single_bucket;
    std::
    _Function_handler<void_(wasm::Function_*,_GlobalInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalRefining.cpp:50:16)>
    ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
    local_348 = (undefined1  [8])&lubs._M_h._M_rehash_policy._M_next_resize;
    lubs._M_h._M_buckets = (__buckets_ptr)0x1;
    lubs._M_h._M_bucket_count = 0;
    lubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    lubs._M_h._M_element_count._0_4_ = 0x3f800000;
    lubs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
    lubs._M_h._M_rehash_policy._1_7_ = 0;
    lubs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
    lubs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0;
    lubs._M_h._M_rehash_policy._M_next_resize._3_1_ = 0;
    lubs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
    if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
      p_Var14 = (_Rb_tree_node_base *)analysis._24_8_;
      do {
        p_Var3 = p_Var14[1]._M_left;
        local_38 = p_Var14;
        for (p_Var19 = p_Var14[1]._M_parent; p_Var19 != p_Var3;
            p_Var19 = (_Base_ptr)&p_Var19->_M_parent) {
          lVar4 = *(long *)p_Var19;
          pmVar12 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_348,(key_type *)(lVar4 + 0x10));
          TVar13 = wasm::Type::getLeastUpperBound
                             ((pmVar12->lub).id,*(uintptr_t *)(*(long *)(lVar4 + 0x20) + 8));
          (pmVar12->lub).id = TVar13.id;
        }
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38);
      } while (p_Var14 != (_Rb_tree_node_base *)&analysis.field_0x8);
    }
    analysis._48_8_ = &unoptimizable._M_h._M_rehash_policy._M_next_resize;
    unoptimizable._M_h._M_buckets = (__buckets_ptr)0x1;
    unoptimizable._M_h._M_bucket_count = 0;
    unoptimizable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    unoptimizable._M_h._M_element_count._0_4_ = 0x3f800000;
    unoptimizable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    unoptimizable._M_h._M_rehash_policy._4_4_ = 0;
    unoptimizable._M_h._M_rehash_policy._M_next_resize = 0;
    TVar13.id = (uintptr_t)local_40;
    ExportUtils::getExportedGlobals
              ((vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)local_258,
               (Module *)local_40);
    pp_Var8 = updater.
              super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
              super_Pass._vptr_Pass;
    if (local_258 !=
        (undefined1  [8])
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass._vptr_Pass) {
      auVar20 = local_258;
      do {
        TVar13.id = (((Function *)auVar20)->super_Importable).super_Named.name.super_IString.str.
                    _M_len;
        if (((((this->super_Pass).runner)->options).closedWorld != false) ||
           (*(char *)(TVar13.id + 0x48) == '\x01')) {
          local_60._M_unused._M_object = &analysis.field_0x30;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&analysis.field_0x30,TVar13.id,&local_60);
        }
        auVar20 = (undefined1  [8])
                  &(((Function *)auVar20)->super_Importable).super_Named.name.super_IString.str.
                   _M_str;
      } while (auVar20 != (undefined1  [8])pp_Var8);
    }
    if (local_258 != (undefined1  [8])0x0) {
      TVar13.id = (long)updater.
                        super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                        .super_Pass.runner - (long)local_258;
      operator_delete((void *)local_258,TVar13.id);
    }
    plVar17 = *(long **)(local_40->_M_pod_data + 0x30);
    plVar5 = *(long **)(local_40->_M_pod_data + 0x38);
    if (plVar17 != plVar5) {
      local_38 = (_Rb_tree_node_base *)((ulong)local_38 & 0xffffffff00000000);
      do {
        TVar13.id = *plVar17;
        if ((*(long *)(TVar13.id + 0x20) == 0) &&
           (sVar15 = std::
                     _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)&analysis.field_0x30,(key_type *)TVar13.id), sVar15 == 0)) {
          pmVar12 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_348,(key_type *)*plVar17);
          TVar13.id = *(uintptr_t *)(*(long *)(*plVar17 + 0x40) + 8);
          left = wasm::Type::getLeastUpperBound((pmVar12->lub).id,TVar13);
          (pmVar12->lub).id = left.id;
          if ((left.id != 1) && (TVar13.id = *(uintptr_t *)(*plVar17 + 0x38), left.id != TVar13.id))
          {
            bVar10 = wasm::Type::isSubType(left,TVar13);
            if (!bVar10) {
              __assert_fail("Type::isSubType(newType, oldType)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalRefining.cpp"
                            ,0x6b,
                            "virtual void wasm::(anonymous namespace)::GlobalRefining::run(Module *)"
                           );
            }
            lVar4 = *plVar17;
            *(uintptr_t *)(lVar4 + 0x38) = left.id;
            local_38 = (_Rb_tree_node_base *)
                       CONCAT44(local_38._4_4_,(int)CONCAT71((int7)((ulong)lVar4 >> 8),1));
          }
        }
        p_Var9 = local_40;
        plVar17 = plVar17 + 1;
      } while (plVar17 != plVar5);
      if (((ulong)local_38 & 1) != 0) {
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass.runner =
             (PassRunner *)
             &updater.
              super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
              super_Pass.name._M_string_length;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass.name._M_dataplus._M_p = (pointer)0x0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass.name._M_string_length._0_1_ = 0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass.passArg.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ = 0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass.passArg.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass.passArg.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._33_7_ = 0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.replacep = (Expression **)0x0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed._M_elems[9].currp =
             (Expression **)0x0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currFunction = (Function *)0x0;
        local_258 = (undefined1  [8])&PTR__WalkerPass_01092658;
        updater.parent = (GlobalRefining *)local_40;
        updater.wasm._0_1_ = 0;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass._vptr_Pass = (_func_int **)(this->super_Pass).runner;
        TVar13.id = (uintptr_t)local_40;
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currModule = (Module *)this;
        WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>::run
                  ((WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_> *)
                   local_258,(Module *)local_40);
        pPVar6 = (this->super_Pass).runner;
        if ((PassRunner *)
            updater.
            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
            super_Pass._vptr_Pass != pPVar6 &&
            updater.
            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
            super_Pass._vptr_Pass != (_func_int **)0x0) goto LAB_00881557;
        this_00 = (Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_> *)
                  ((long)&updater.
                          super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                          .super_Pass.passArg.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  + 0x20);
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currFunction = (Function *)p_Var9
        ;
        puVar7 = *(undefined8 **)(p_Var9->_M_pod_data + 0x38);
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_Pass._vptr_Pass = (_func_int **)pPVar6;
        for (puVar16 = *(undefined8 **)(p_Var9->_M_pod_data + 0x30); puVar16 != puVar7;
            puVar16 = puVar16 + 1) {
          TVar13.id = *puVar16;
          if (*(Expression **)(TVar13.id + 0x20) == (Expression *)0x0) {
            TVar13.id = TVar13.id + 0x40;
            Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                      (this_00,(Expression **)TVar13.id);
          }
        }
        p_Var14 = *(_Rb_tree_node_base **)(local_40->_M_pod_data + 0x60);
        local_38 = *(_Rb_tree_node_base **)(local_40->_M_pod_data + 0x68);
        if (p_Var14 != local_38) {
          do {
            TVar13.id = *(uintptr_t *)p_Var14;
            if (*(Expression **)(TVar13.id + 0x28) != (Expression *)0x0) {
              TVar13.id = TVar13.id + 0x28;
              Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                        (this_00,(Expression **)TVar13.id);
            }
            plVar5 = *(long **)(*(long *)p_Var14 + 0x40);
            for (plVar17 = *(long **)(*(long *)p_Var14 + 0x38); plVar17 != plVar5;
                plVar17 = plVar17 + 1) {
              local_60._M_unused._0_8_ = (undefined8)*plVar17;
              TVar13.id = (uintptr_t)&local_60;
              Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                        (this_00,(Expression **)&local_60);
            }
            p_Var14 = (_Rb_tree_node_base *)&p_Var14->_M_parent;
          } while (p_Var14 != local_38);
        }
        puVar7 = *(undefined8 **)(local_40->_M_pod_data + 0x98);
        for (puVar16 = *(undefined8 **)(local_40->_M_pod_data + 0x90); puVar16 != puVar7;
            puVar16 = puVar16 + 1) {
          TVar13.id = *puVar16;
          if (*(Expression **)(TVar13.id + 0x30) != (Expression *)0x0) {
            TVar13.id = TVar13.id + 0x30;
            Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                      (this_00,(Expression **)TVar13.id);
          }
        }
        updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
        super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
        super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currFunction = (Function *)0x0;
        if (updater.
            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
            super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
            super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed._M_elems[9].currp
            != (Expression **)0x0) {
          TVar13.id = (long)updater.
                            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                            .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
                            super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.
                            flexible.
                            super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)updater.
                            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                            .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
                            super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed.
                            _M_elems[9].currp;
          operator_delete(updater.
                          super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                          .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
                          super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed.
                          _M_elems[9].currp,TVar13.id);
        }
        Pass::~Pass((Pass *)local_258);
      }
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&analysis.field_0x30);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_348);
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_GlobalInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_GlobalInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
    ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_GlobalInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_GlobalInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                *)analysis._16_8_,(_Link_type)TVar13.id);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the global.sets.

    struct GlobalInfo {
      std::vector<GlobalSet*> sets;
    };

    ModuleUtils::ParallelFunctionAnalysis<GlobalInfo> analysis(
      *module, [&](Function* func, GlobalInfo& info) {
        if (func->imported()) {
          return;
        }
        info.sets = std::move(FindAll<GlobalSet>(func->body).list);
      });

    // A map of globals to the lub for that global.
    std::unordered_map<Name, LUBFinder> lubs;

    // Combine all the information we gathered and compute lubs.
    for (auto& [func, info] : analysis.map) {
      for (auto* set : info.sets) {
        lubs[set->name].note(set->value->type);
      }
    }

    // In closed world we cannot change the types of exports, as we might change
    // from a public type to a private that would cause a validation error.
    // TODO We could refine to a type that is still public, however.
    //
    // We are also limited in open world: in that mode we must assume that
    // another module might import our exported globals with the current type
    // (that type is a contract between them), and in such a case the type of
    // mutable globals must match precisely (the same rule as for mutable struct
    // fields in subtypes - the types must match exactly, or else a write in
    // one place could store a type considered in valid in another place).
    std::unordered_set<Name> unoptimizable;
    for (auto* global : ExportUtils::getExportedGlobals(*module)) {
      if (getPassOptions().closedWorld || global->mutable_) {
        unoptimizable.insert(global->name);
      }
    }

    bool optimized = false;

    for (auto& global : module->globals) {
      if (global->imported() || unoptimizable.count(global->name)) {
        continue;
      }

      auto& lub = lubs[global->name];

      // Note the initial value.
      lub.note(global->init->type);

      // The initial value cannot be unreachable, but it might be null, and all
      // other values might be too. In that case, we've noted nothing useful
      // and we can move on.
      if (!lub.noted()) {
        continue;
      }

      auto oldType = global->type;
      auto newType = lub.getLUB();
      if (newType != oldType) {
        // We found an improvement!
        assert(Type::isSubType(newType, oldType));
        global->type = newType;
        optimized = true;
      }
    }

    if (!optimized) {
      return;
    }

    // Update function contents for their new parameter types: global.gets must
    // now return the new type for any globals that we modified.
    struct GetUpdater : public WalkerPass<PostWalker<GetUpdater>> {
      bool isFunctionParallel() override { return true; }

      // Only modifies global.get operations.
      bool requiresNonNullableLocalFixups() override { return false; }

      GlobalRefining& parent;
      Module& wasm;

      GetUpdater(GlobalRefining& parent, Module& wasm)
        : parent(parent), wasm(wasm) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<GetUpdater>(parent, wasm);
      }

      // If we modify anything in a function then we must refinalize so that
      // types propagate outwards.
      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        auto oldType = curr->type;
        auto newType = wasm.getGlobal(curr->name)->type;
        if (newType != oldType) {
          curr->type = newType;
          modified = true;
        }
      }

      void visitFunction(Function* curr) {
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, &wasm);
        }
      }
    } updater(*this, *module);
    updater.run(getPassRunner(), module);
    updater.runOnModuleCode(getPassRunner(), module);
  }